

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_3_4::ThreadPool::setThreadProvider(ThreadPool *this,ThreadPoolProvider *provider)

{
  Data *this_00;
  __shared_ptr<IlmThread_3_4::ThreadPoolProvider,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this_00 = this->_data;
  std::__shared_ptr<IlmThread_3_4::ThreadPoolProvider,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<IlmThread_3_4::ThreadPoolProvider,void>(local_20,provider);
  Data::setProvider(this_00,(ProviderPtr *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void
ThreadPool::setThreadProvider (ThreadPoolProvider* provider)
{
#ifdef ENABLE_THREADING
    // contract is we take ownership and will free the provider
    _data->setProvider (Data::ProviderPtr (provider));
#else
    throw IEX_INTERNAL_NAMESPACE::ArgExc (
        "Attempt to set a thread provider on a system with threads"
        " disabled / not available");
#endif
}